

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

void __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::File
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this,path *filename,
          openmode mode)

{
  Catch::clara::std::filesystem::__cxx11::path::path((path *)this,(path *)filename);
  std::fstream::fstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((fstream *)&this->stream_,filename,mode | _S_bin);
  (this->data_begin_)._M_off = 0;
  (this->data_begin_)._M_state.__count = 0;
  (this->data_begin_)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  check_stream(this,"open file");
  return;
}

Assistant:

File(const std::filesystem::path& filename, std::ios_base::openmode mode)
    : filename_(filename), stream_(filename, mode | std::ios_base::binary)
    {
        check_stream("open file");
    }